

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void cscPrintDense(char *s,CUPDLPcsc *csc)

{
  long lVar1;
  cupdlp_int *pcVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  puts("------------------------------------------------");
  printf("%s (Trans):\n",s);
  if (0 < csc->nCols) {
    lVar4 = 0;
    do {
      pcVar2 = csc->colMatBeg;
      lVar3 = (long)pcVar2[lVar4];
      lVar1 = lVar4 + 1;
      if (pcVar2[lVar4] < pcVar2[lVar4 + 1]) {
        do {
          iVar5 = csc->colMatIdx[lVar3];
          if (pcVar2[lVar4] != (int)lVar3) {
            iVar5 = iVar5 + ~csc->colMatIdx[lVar3 + -1];
          }
          if (0 < iVar5) {
            do {
              printf("       ");
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          printf("%6.3f ",csc->colMatElem[lVar3]);
          lVar3 = lVar3 + 1;
          pcVar2 = csc->colMatBeg;
        } while (lVar3 < pcVar2[lVar1]);
      }
      putchar(10);
      lVar4 = lVar1;
    } while (lVar1 < csc->nCols);
  }
  puts("------------------------------------------------");
  return;
}

Assistant:

void cscPrintDense(const char *s, CUPDLPcsc *csc) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s (Trans):\n", s);
  cupdlp_int deltaRow = 0;
  for (cupdlp_int iCol = 0; iCol < csc->nCols; ++iCol) {
    for (cupdlp_int iElem = csc->colMatBeg[iCol];
         iElem < csc->colMatBeg[iCol + 1]; ++iElem) {
      if (iElem == csc->colMatBeg[iCol])
        deltaRow = csc->colMatIdx[iElem];
      else
        deltaRow = csc->colMatIdx[iElem] - csc->colMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaRow; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csc->colMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}